

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

double Cudd_CountPath(DdNode *node)

{
  st__table *table;
  double dVar1;
  
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) {
    dVar1 = -1.0;
  }
  else {
    dVar1 = ddCountPathAux((DdNode *)((ulong)node & 0xfffffffffffffffe),table);
    st__foreach(table,cuddStCountfree,(char *)0x0);
    st__free_table(table);
  }
  return dVar1;
}

Assistant:

double
Cudd_CountPath(
  DdNode * node)
{

    st__table    *table;
    double      i;

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    i = ddCountPathAux(Cudd_Regular(node),table);
    st__foreach(table, cuddStCountfree, NULL);
    st__free_table(table);
    return(i);

}